

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs_poll.c
# Opt level: O1

int luv_fs_poll_getpath(lua_State *L)

{
  int iVar1;
  uv_fs_poll_t *handle;
  int in_ESI;
  size_t len;
  char buf [8192];
  size_t local_2010;
  char local_2008 [8192];
  
  handle = luv_check_fs_poll(L,in_ESI);
  local_2010 = 0x2000;
  iVar1 = uv_fs_poll_getpath(handle,local_2008,&local_2010);
  if (iVar1 < 0) {
    luv_error(L,iVar1);
    iVar1 = 3;
  }
  else {
    lua_pushlstring(L,local_2008,local_2010);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int luv_fs_poll_getpath(lua_State* L) {
  uv_fs_poll_t* handle = luv_check_fs_poll(L, 1);
  size_t len = 2*PATH_MAX;
  char buf[2*PATH_MAX];
  int ret = uv_fs_poll_getpath(handle, buf, &len);
  if (ret < 0) return luv_error(L, ret);
  lua_pushlstring(L, buf, len);
  return 1;
}